

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::AddSnappedEdges
          (S2Builder *this,InputEdgeId begin,InputEdgeId end,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  pointer *pppVar1;
  compact_array_base<int,_std::allocator<int>_> *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  EdgeType EVar6;
  pointer pcVar7;
  iterator iVar8;
  iterator iVar9;
  pointer ppVar10;
  VType VVar11;
  pair<int,_int> pVar12;
  pair<int,_int> pVar13;
  pair<int,_int> pVar14;
  pair<int,_int> pVar15;
  iterator pvVar16;
  ostream *poVar17;
  ulong uVar18;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar19;
  ulong uVar20;
  Vector3<double> *__args;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points;
  InputEdgeId e;
  pointer ppVar21;
  vector<int,_std::allocator<int>_> chain;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> v;
  ulong local_b0;
  string local_a8;
  S2Builder *local_88;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  void *local_58;
  iterator iStack_50;
  Vector3<double> *local_48;
  DegenerateEdges local_40;
  InputEdgeId local_3c;
  GraphOptions *local_38;
  
  local_40 = options->degenerate_edges_;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88 = this;
  local_7c = begin;
  local_3c = end;
  local_38 = options;
  if (begin < end) {
    local_b0 = (ulong)(uint)begin;
    do {
      if (local_7c < 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.h"
                   ,0xad,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_a8._M_string_length,"Check failed: (id) >= (0) ",0x1a);
        abort();
      }
      e = (InputEdgeId)local_b0;
      SnapEdge(local_88,e,&local_78);
      pcVar7 = (site_vertices->
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pcVar7 != (site_vertices->
                    super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        iVar4 = (local_88->input_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[local_b0].first;
        iVar5 = *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = &pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_>;
        bVar3 = pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_;
        uVar18 = (ulong)*(uint *)&pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_>
                 & 0xffffff;
        if ((*(uint *)&pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff)
            == 0) {
          if ((bVar3 & 1U) == 0) {
            paVar19 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                       *)(pcVar2->field_7).pointer_;
          }
          else {
            paVar19 = &pcVar2->field_7;
          }
          uVar18 = 0;
        }
        else {
          if ((bVar3 & 1U) == 0) {
            paVar19 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                       *)(pcVar2->field_7).pointer_;
          }
          else {
            paVar19 = &pcVar2->field_7;
          }
          if (*(int *)((long)paVar19 + uVar18 * 4 + -4) == iVar4) goto LAB_001abc4a;
        }
        pvVar16 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                            (pcVar2,(const_iterator)((long)paVar19 + uVar18 * 4),1);
        *pvVar16 = iVar4;
      }
LAB_001abc4a:
      uVar18 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar18 == 4) {
        if (local_40 != DISCARD) {
          iVar4 = *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          EVar6 = local_38->edge_type_;
          local_58 = (void *)CONCAT44(local_58._4_4_,e);
          iVar8._M_current =
               (edges->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_a8._M_dataplus._M_p._0_4_ = iVar4;
          local_a8._M_dataplus._M_p._4_4_ = iVar4;
          if (iVar8._M_current ==
              (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,iVar8,
                       (pair<int,_int> *)&local_a8);
          }
          else {
            pVar12.second = iVar4;
            pVar12.first = iVar4;
            *iVar8._M_current = pVar12;
            pppVar1 = &(edges->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          iVar9._M_current =
               (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)input_edge_ids,iVar9,(int *)&local_58);
          }
          else {
            *iVar9._M_current = e;
            (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          if (EVar6 == UNDIRECTED) {
            iVar8._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_a8._M_dataplus._M_p._0_4_ = iVar4;
              local_a8._M_dataplus._M_p._4_4_ = iVar4;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         iVar8,(pair<int,_int> *)&local_a8);
            }
            else {
              pVar13.second = iVar4;
              pVar13.first = iVar4;
              *iVar8._M_current = pVar13;
              pppVar1 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
              local_a8._M_dataplus._M_p._4_4_ = iVar4;
            }
            local_a8._M_dataplus._M_p._0_4_ = -0x80000000;
            iVar9._M_current =
                 (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (input_edge_ids,iVar9,(int *)&local_a8);
            }
            else {
              *iVar9._M_current = -0x80000000;
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
        }
      }
      else {
        pcVar7 = (site_vertices->
                 super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pcVar7 != (site_vertices->
                      super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          iVar4 = (local_88->input_edges_).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_b0].second;
          iVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          pcVar2 = &pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_>;
          bVar3 = pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_;
          uVar20 = (ulong)*(uint *)&pcVar7[iVar5].
                                    super_compact_array_base<int,_std::allocator<int>_> & 0xffffff;
          if ((*(uint *)&pcVar7[iVar5].super_compact_array_base<int,_std::allocator<int>_> &
              0xffffff) == 0) {
            if ((bVar3 & 1U) == 0) {
              paVar19 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                         *)(pcVar2->field_7).pointer_;
            }
            else {
              paVar19 = &pcVar2->field_7;
            }
            uVar20 = 0;
          }
          else {
            if ((bVar3 & 1U) == 0) {
              paVar19 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                         *)(pcVar2->field_7).pointer_;
            }
            else {
              paVar19 = &pcVar2->field_7;
            }
            if (*(int *)((long)paVar19 + uVar20 * 4 + -4) == iVar4) goto LAB_001abd94;
          }
          pvVar16 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                              (pcVar2,(const_iterator)((long)paVar19 + uVar20 * 4),1);
          *pvVar16 = iVar4;
          uVar18 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
LAB_001abd94:
        if (4 < uVar18) {
          uVar18 = 1;
          do {
            iVar4 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar18 - 1];
            iVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar18];
            EVar6 = local_38->edge_type_;
            local_58 = (void *)CONCAT44(local_58._4_4_,e);
            iVar8._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_a8._M_dataplus._M_p._0_4_ = iVar4;
            local_a8._M_dataplus._M_p._4_4_ = iVar5;
            if (iVar8._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         iVar8,(pair<int,_int> *)&local_a8);
            }
            else {
              pVar14.second = iVar5;
              pVar14.first = iVar4;
              *iVar8._M_current = pVar14;
              pppVar1 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            iVar9._M_current =
                 (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)input_edge_ids,iVar9,(int *)&local_58);
            }
            else {
              *iVar9._M_current = e;
              (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            if (EVar6 == UNDIRECTED) {
              iVar8._M_current =
                   (edges->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              local_a8._M_dataplus._M_p._4_4_ = iVar4;
              if (iVar8._M_current ==
                  (edges->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_a8._M_dataplus._M_p._0_4_ = iVar5;
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                           iVar8,(pair<int,_int> *)&local_a8);
              }
              else {
                pVar15.second = iVar4;
                pVar15.first = iVar5;
                *iVar8._M_current = pVar15;
                pppVar1 = &(edges->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
              }
              local_a8._M_dataplus._M_p._0_4_ = -0x80000000;
              iVar9._M_current =
                   (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (input_edge_ids,iVar9,(int *)&local_a8);
              }
              else {
                *iVar9._M_current = -0x80000000;
                (input_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      local_b0 = local_b0 + 1;
    } while ((int)local_b0 < local_3c);
  }
  if (s2builder_verbose != false) {
    ppVar21 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar10 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar21 != ppVar10) {
      do {
        local_58 = (void *)0x0;
        iStack_50._M_current = (Vector3<double> *)0x0;
        local_48 = (Vector3<double> *)0x0;
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_58,
                   (iterator)0x0,
                   (local_88->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start + ppVar21->first);
        __args = (local_88->sites_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start + ppVar21->second;
        if (iStack_50._M_current == local_48) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>
                    ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_58,iStack_50,
                     __args);
        }
        else {
          (iStack_50._M_current)->c_[2] = __args->c_[2];
          VVar11 = __args->c_[1];
          (iStack_50._M_current)->c_[0] = __args->c_[0];
          (iStack_50._M_current)->c_[1] = VVar11;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2Polyline: ",0xc)
        ;
        s2textformat::ToString_abi_cxx11_(&local_a8,(s2textformat *)&local_58,points);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                              (int)local_a8._M_dataplus._M_p),
                             local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(",1);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,ppVar21->first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,ppVar21->second);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
        }
        if (local_58 != (void *)0x0) {
          operator_delete(local_58);
        }
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 != ppVar10);
    }
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2Builder::AddSnappedEdges(
    InputEdgeId begin, InputEdgeId end, const GraphOptions& options,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  bool discard_degenerate_edges = (options.degenerate_edges() ==
                                   GraphOptions::DegenerateEdges::DISCARD);
  vector<SiteId> chain;
  for (InputEdgeId e = begin; e < end; ++e) {
    InputEdgeIdSetId id = input_edge_id_set_lexicon->AddSingleton(e);
    SnapEdge(e, &chain);
    MaybeAddInputVertex(input_edges_[e].first, chain[0], site_vertices);
    if (chain.size() == 1) {
      if (discard_degenerate_edges) continue;
      AddSnappedEdge(chain[0], chain[0], id, options.edge_type(),
                     edges, input_edge_ids);
    } else {
      MaybeAddInputVertex(input_edges_[e].second, chain.back(), site_vertices);
      for (int i = 1; i < chain.size(); ++i) {
        AddSnappedEdge(chain[i-1], chain[i], id, options.edge_type(),
                       edges, input_edge_ids);
      }
    }
  }
  if (s2builder_verbose) DumpEdges(*edges, sites_);
}